

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_st.c
# Opt level: O0

err_t cmdStBign(void)

{
  err_t eVar1;
  bool_t bVar2;
  octet sig [48];
  octet oid [11];
  octet hash [32];
  octet pubkey [64];
  octet privkey [32];
  bign_params params [1];
  octet state [1024];
  bign_params *in_stack_fffffffffffff9c8;
  void *in_stack_fffffffffffff9d0;
  octet *in_stack_fffffffffffff9d8;
  void *in_stack_fffffffffffff9e0;
  undefined1 *buf;
  octet *in_stack_fffffffffffffa00;
  bign_params *in_stack_fffffffffffffa08;
  gen_i in_stack_fffffffffffffa10;
  undefined5 in_stack_fffffffffffffa18;
  undefined3 uVar3;
  undefined5 uVar4;
  undefined2 uVar5;
  undefined1 uVar6;
  octet *in_stack_fffffffffffffa28;
  octet *in_stack_fffffffffffffa38;
  octet *in_stack_fffffffffffffa40;
  octet *in_stack_fffffffffffffa48;
  size_t in_stack_fffffffffffffa50;
  octet *in_stack_fffffffffffffa58;
  bign_params *in_stack_fffffffffffffa60;
  octet *in_stack_fffffffffffffa68;
  void *in_stack_fffffffffffffa80;
  size_t in_stack_fffffffffffffa88;
  undefined1 local_408 [1032];
  
  uVar3 = 0x2a0906;
  uVar4 = 0x2200020070;
  uVar5 = 0x1f65;
  uVar6 = 0x51;
  hexTo(in_stack_fffffffffffff9d0,(char *)in_stack_fffffffffffff9c8);
  prngEchoStart(local_408,&stack0xfffffffffffffa88,0x20);
  eVar1 = bignParamsStd(in_stack_fffffffffffff9c8,(char *)0x10c1ab);
  if (((eVar1 != 0) ||
      (eVar1 = bignKeypairGen(in_stack_fffffffffffffa28,
                              (octet *)CONCAT17(uVar6,CONCAT25(uVar5,uVar4)),
                              (bign_params *)CONCAT35(uVar3,in_stack_fffffffffffffa18),
                              in_stack_fffffffffffffa10,in_stack_fffffffffffffa08), eVar1 != 0)) ||
     (bVar2 = hexEq(in_stack_fffffffffffff9e0,(char *)in_stack_fffffffffffff9d8), bVar2 == 0)) {
    return 0x20a;
  }
  eVar1 = bignPubkeyVal(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  if (eVar1 != 0) {
    return 0x20a;
  }
  buf = &stack0xfffffffffffffa28;
  beltH();
  eVar1 = beltHash(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
                   (size_t)in_stack_fffffffffffff9c8);
  if (eVar1 != 0) {
    return 0x20a;
  }
  eVar1 = bignSign2(in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                    in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
                    in_stack_fffffffffffffa80,in_stack_fffffffffffffa88);
  if (eVar1 != 0) {
    return 0x20a;
  }
  bVar2 = hexEq(buf,(char *)in_stack_fffffffffffff9d8);
  if (bVar2 == 0) {
    return 0x20a;
  }
  eVar1 = bignVerify(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
                     in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  if (eVar1 != 0) {
    return 0x20a;
  }
  eVar1 = bignVerify(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
                     in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  if (eVar1 == 0) {
    return 0x20a;
  }
  return 0;
}

Assistant:

static err_t cmdStBign()
{
	octet state[1024];
	bign_params params[1];
	octet privkey[32];
	octet pubkey[64];
	octet hash[32];
	const octet oid[] = {
		0x06, 0x09, 0x2A, 0x70, 0x00, 0x02, 0x00, 0x22, 0x65, 0x1F, 0x51,
	};
	octet sig[48];
	// bign-genkeypair
	hexTo(privkey,
		"1F66B5B84B7339674533F0329C74F218"
		"34281FED0732429E0C79235FC273E269");
	ASSERT(sizeof(state) >= prngEcho_keep());
	prngEchoStart(state, privkey, 32);
	if (bignParamsStd(params, "1.2.112.0.2.0.34.101.45.3.1") != ERR_OK ||
		bignKeypairGen(privkey, pubkey, params, prngEchoStepR,
			state) != ERR_OK ||
		!hexEq(pubkey,
			"BD1A5650179D79E03FCEE49D4C2BD5DD"
			"F54CE46D0CF11E4FF87BF7A890857FD0"
			"7AC6A60361E8C8173491686D461B2826"
			"190C2EDA5909054A9AB84D2AB9D99A90"))
		return ERR_SELFTEST;
	// bign-valpubkey
	if (bignPubkeyVal(params, pubkey) != ERR_OK)
		return ERR_SELFTEST;
	// bign-sign
	if (beltHash(hash, beltH(), 13) != ERR_OK)
		return ERR_SELFTEST;
	if (bignSign2(sig, params, oid, sizeof(oid), hash, privkey,
		0, 0) != ERR_OK)
		return ERR_SELFTEST;
	if (!hexEq(sig,
		"19D32B7E01E25BAE4A70EB6BCA42602C"
		"CA6A13944451BCC5D4C54CFD8737619C"
		"328B8A58FB9C68FD17D569F7D06495FB"))
		return ERR_SELFTEST;
	if (bignVerify(params, oid, sizeof(oid), hash, sig, pubkey) != ERR_OK)
		return ERR_SELFTEST;
	sig[0] ^= 1;
	if (bignVerify(params, oid, sizeof(oid), hash, sig, pubkey) == ERR_OK)
		return ERR_SELFTEST;
	// все нормально
	return ERR_OK;
}